

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O0

void __thiscall
Diligent::GLProgram::GLProgram
          (GLProgram *this,ShaderGLImpl **ppShaders,Uint32 NumShaders,bool IsSeparableProgram)

{
  ShaderGLImpl *this_00;
  PFNGLATTACHSHADERPROC p_Var1;
  PFNGLLINKPROGRAMPROC p_Var2;
  PFNGLPROGRAMPARAMETERIPROC p_Var3;
  GLuint GVar4;
  GLuint GVar5;
  Char *pCVar6;
  ulong uVar7;
  undefined1 local_c8 [8];
  string msg_3;
  undefined1 local_a0 [4];
  GLenum err_2;
  string msg_2;
  GLenum err_1;
  ShaderGLImpl *pCurrShader;
  undefined1 local_68 [4];
  Uint32 i;
  string msg_1;
  undefined1 local_40 [4];
  GLenum err;
  string msg;
  bool IsSeparableProgram_local;
  Uint32 NumShaders_local;
  ShaderGLImpl **ppShaders_local;
  GLProgram *this_local;
  
  msg.field_2._M_local_buf[0xb] = IsSeparableProgram;
  msg.field_2._12_4_ = NumShaders;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>::GLObjWrapper
            (&this->m_GLProg,1);
  uVar7 = (ulong)(uint)msg.field_2._12_4_;
  std::allocator<const_Diligent::ShaderGLImpl_*>::allocator
            ((allocator<const_Diligent::ShaderGLImpl_*> *)(msg.field_2._M_local_buf + 9));
  std::vector<Diligent::ShaderGLImpl_const*,std::allocator<Diligent::ShaderGLImpl_const*>>::
  vector<Diligent::ShaderGLImpl*const*,void>
            ((vector<Diligent::ShaderGLImpl_const*,std::allocator<Diligent::ShaderGLImpl_const*>> *)
             &this->m_AttachedShaders,ppShaders,ppShaders + uVar7,
             (allocator<const_Diligent::ShaderGLImpl_*> *)(msg.field_2._M_local_buf + 9));
  std::allocator<const_Diligent::ShaderGLImpl_*>::~allocator
            ((allocator<const_Diligent::ShaderGLImpl_*> *)(msg.field_2._M_local_buf + 9));
  std::__cxx11::string::string((string *)&this->m_InfoLog);
  this->m_LinkStatus = Undefined;
  this->m_BindingsApplied = false;
  std::shared_ptr<const_Diligent::ShaderResourcesGL>::shared_ptr(&this->m_pResources);
  memset(&this->m_DbgBaseBindings,0,8);
  if (((msg.field_2._M_local_buf[0xb] & 1U) != 0) && (msg.field_2._12_4_ != 1)) {
    FormatString<char[62]>
              ((string *)local_40,
               (char (*) [62])"Number of shaders must be 1 when separable program is created");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x29);
    std::__cxx11::string::~string((string *)local_40);
  }
  p_Var3 = __glewProgramParameteri;
  if ((msg.field_2._M_local_buf[0xb] & 1U) != 0) {
    GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this);
    (*p_Var3)(GVar4,0x8258,1);
    msg_1.field_2._12_4_ = glGetError();
    if (msg_1.field_2._12_4_ != 0) {
      LogError<false,char[49],char[17],unsigned_int>
                (false,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x2f,(char (*) [49])"glProgramParameteri(GL_PROGRAM_SEPARABLE) failed",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_68,(char (*) [6])0xe8e72e);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x2f);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  for (pCurrShader._4_4_ = 0; p_Var2 = __glewLinkProgram, p_Var1 = __glewAttachShader,
      pCurrShader._4_4_ < (uint)msg.field_2._12_4_; pCurrShader._4_4_ = pCurrShader._4_4_ + 1) {
    this_00 = ppShaders[pCurrShader._4_4_];
    GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this);
    GVar5 = ShaderGLImpl::GetGLShaderHandle(this_00);
    (*p_Var1)(GVar4,GVar5);
    msg_2.field_2._12_4_ = glGetError();
    if (msg_2.field_2._12_4_ != 0) {
      LogError<false,char[24],char[17],unsigned_int>
                (false,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x36,(char (*) [24])"glAttachShader() failed",(char (*) [17])"\nGL Error Code: ",
                 (uint *)(msg_2.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_a0,(char (*) [6])0xe8e72e);
      pCVar6 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar6,"GLProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
                 ,0x36);
      std::__cxx11::string::~string((string *)local_a0);
    }
  }
  GVar4 = GLObjectWrappers::GLObjWrapper::operator_cast_to_unsigned_int((GLObjWrapper *)this);
  (*p_Var2)(GVar4);
  msg_3.field_2._12_4_ = glGetError();
  if (msg_3.field_2._12_4_ != 0) {
    LogError<false,char[23],char[17],unsigned_int>
              (false,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x44,(char (*) [23])"glLinkProgram() failed",(char (*) [17])"\nGL Error Code: ",
               (uint *)(msg_3.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)local_c8,(char (*) [6])0xe8e72e);
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"GLProgram",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLProgram.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)local_c8);
  }
  this->m_LinkStatus = InProgress;
  return;
}

Assistant:

GLProgram::GLProgram(ShaderGLImpl* const* ppShaders,
                     Uint32               NumShaders,
                     bool                 IsSeparableProgram) noexcept :
    m_AttachedShaders{ppShaders, ppShaders + NumShaders}
{
    VERIFY(!IsSeparableProgram || NumShaders == 1, "Number of shaders must be 1 when separable program is created");

    // GL_PROGRAM_SEPARABLE parameter must be set before linking!
    if (IsSeparableProgram)
    {
        glProgramParameteri(m_GLProg, GL_PROGRAM_SEPARABLE, GL_TRUE);
        DEV_CHECK_GL_ERROR("glProgramParameteri(GL_PROGRAM_SEPARABLE) failed");
    }

    for (Uint32 i = 0; i < NumShaders; ++i)
    {
        auto* pCurrShader = ppShaders[i];
        glAttachShader(m_GLProg, pCurrShader->GetGLShaderHandle());
        DEV_CHECK_GL_ERROR("glAttachShader() failed");
    }

    //With separable program objects, interfaces between shader stages may
    //involve the outputs from one program object and the inputs from a
    //second program object. For such interfaces, it is not possible to
    //detect mismatches at link time, because the programs are linked
    //separately. When each such program is linked, all inputs or outputs
    //interfacing with another program stage are treated as active. The
    //linker will generate an executable that assumes the presence of a
    //compatible program on the other side of the interface. If a mismatch
    //between programs occurs, no GL error will be generated, but some or all
    //of the inputs on the interface will be undefined.
    glLinkProgram(m_GLProg);
    DEV_CHECK_GL_ERROR("glLinkProgram() failed");

    // Note: according to the spec, shaders can be detached immediately after glLinkProgram call.
    //       However, on NVidia GPUs this completely disables the GL_KHR_parallel_shader_compile
    //       extension, which barely works already. So we keep shaders attached until the program
    //       is linked.

    m_LinkStatus = LinkStatus::InProgress;
}